

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void output_line(Context *ctx,char *fmt,...)

{
  int iVar1;
  Buffer *pBVar2;
  char *_data;
  long lVar3;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined1 *__s;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __n;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  code *pcStack_100;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list ap;
  
  __s = local_f8;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  pBVar2 = ctx->output;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (pBVar2 != (Buffer *)0x0) {
    if (ctx->isfail == 0) {
      __n = (size_t)ctx->indent;
      if (0 < (long)__n) {
        lVar3 = -(__n + 0xf & 0xfffffffffffffff0);
        __s = local_f8 + lVar3;
        *(undefined8 *)(local_f8 + lVar3 + -8) = 0x110bd0;
        memset(__s,9,__n);
        *(undefined8 *)(local_f8 + lVar3 + -8) = 0x110bde;
        buffer_append(pBVar2,__s,__n);
      }
      ap[0].overflow_arg_area = local_f8;
      ap[0]._0_8_ = &stack0x00000008;
      local_48._0_4_ = 0x10;
      local_48._4_4_ = 0x30;
      pBVar2 = ctx->output;
      *(undefined8 *)(__s + -8) = 0x110c0e;
      buffer_append_va(pBVar2,fmt,(__va_list_tag *)local_48);
      pBVar2 = ctx->output;
      _data = ctx->endline;
      iVar1 = ctx->endline_len;
      *(undefined8 *)(__s + -8) = 0x110c25;
      buffer_append(pBVar2,_data,(long)iVar1);
    }
    return;
  }
  pcStack_100 = get_D3D_register_string;
  __assert_fail("ctx->output != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x1bc,"void output_line(Context *, const char *, ...)");
}

Assistant:

static void output_line(Context *ctx, const char *fmt, ...)
{
    assert(ctx->output != NULL);
    if (isfail(ctx))
        return;  // we failed previously, don't go on...

    const int indent = ctx->indent;
    if (indent > 0)
    {
        char *indentbuf = (char *) alloca(indent);
        memset(indentbuf, '\t', indent);
        buffer_append(ctx->output, indentbuf, indent);
    } // if

    va_list ap;
    va_start(ap, fmt);
    buffer_append_va(ctx->output, fmt, ap);
    va_end(ap);

    buffer_append(ctx->output, ctx->endline, ctx->endline_len);
}